

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RotationY.cpp
# Opt level: O2

void __thiscall
qclab::qgates::RotationY<float>::apply
          (RotationY<float> *this,Op op,int nbQubits,vector<float,_std::allocator<float>_> *vector,
          int offset)

{
  float fVar1;
  int iVar2;
  float c;
  anon_class_24_4_61ab1aa0 f;
  anon_class_24_4_61ab1aa0 local_40;
  
  iVar2 = (*(this->super_QRotationGate1<float>).super_QGate1<float>.super_QObject<float>.
            _vptr_QObject[3])();
  local_40.c = (this->super_QRotationGate1<float>).rotation_.angle_.cos_;
  fVar1 = (this->super_QRotationGate1<float>).rotation_.angle_.sin_;
  local_40.vector =
       (vector->super__Vector_base<float,_std::allocator<float>_>)._M_impl.super__Vector_impl_data.
       _M_start;
  local_40.s1 = -fVar1;
  local_40.s2 = fVar1;
  if (op != NoTrans) {
    local_40.s2 = local_40.s1;
    local_40.s1 = fVar1;
  }
  apply2<qclab::qgates::lambda_RotationY<float,float>(qclab::Op,float,float,float*)::_lambda(unsigned_long,unsigned_long)_1_>
            (nbQubits,iVar2 + offset,&local_40);
  return;
}

Assistant:

void RotationY< T >::apply( Op op , const int nbQubits ,
                              std::vector< T >& vector ,
                              const int offset ) const {
    const int qubit = this->qubit() + offset ;
    auto f = lambda_RotationY( op , this->cos() , this->sin() , vector.data() );
    apply2( nbQubits , qubit , f ) ;
  }